

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.h
# Opt level: O2

SigmoidKernel * __thiscall CoreML::Specification::Kernel::mutable_sigmoidkernel(Kernel *this)

{
  SigmoidKernel *this_00;
  
  if (this->_oneof_case_[0] == 4) {
    this_00 = (SigmoidKernel *)(this->kernel_).linearkernel_;
  }
  else {
    clear_kernel(this);
    this->_oneof_case_[0] = 4;
    this_00 = (SigmoidKernel *)operator_new(0x28);
    SigmoidKernel::SigmoidKernel(this_00);
    (this->kernel_).sigmoidkernel_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::SigmoidKernel* Kernel::mutable_sigmoidkernel() {
  if (!has_sigmoidkernel()) {
    clear_kernel();
    set_has_sigmoidkernel();
    kernel_.sigmoidkernel_ = new ::CoreML::Specification::SigmoidKernel;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Kernel.sigmoidKernel)
  return kernel_.sigmoidkernel_;
}